

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Builder * __thiscall
capnp::Orphan<capnp::DynamicList>::get
          (Builder *__return_storage_ptr__,Orphan<capnp::DynamicList> *this)

{
  ListBuilder builder;
  ListBuilder builder_00;
  ListSchema schema;
  ListSchema schema_00;
  ElementSize elementSize;
  Which WVar1;
  ListBuilder local_90;
  undefined8 local_68;
  anon_union_8_2_eba6ea51_for_Type_5 local_60;
  Schema local_58;
  StructSize local_4c;
  ListBuilder local_48;
  undefined8 local_20;
  anon_union_8_2_eba6ea51_for_Type_5 local_18;
  Orphan<capnp::DynamicList> *local_10;
  Orphan<capnp::DynamicList> *this_local;
  
  local_10 = this;
  WVar1 = ListSchema::whichElementType(&this->schema);
  if (WVar1 == STRUCT) {
    local_20._0_2_ = (this->schema).elementType.baseType;
    local_20._2_1_ = (this->schema).elementType.listDepth;
    local_20._3_1_ = (this->schema).elementType.isImplicitParam;
    local_20._4_2_ = (this->schema).elementType.field_3;
    local_20._6_2_ = *(undefined2 *)&(this->schema).elementType.field_0x6;
    local_18 = (anon_union_8_2_eba6ea51_for_Type_5)(this->schema).elementType.field_4.schema;
    local_58.raw = (RawBrandedSchema *)ListSchema::getStructElementType(&this->schema);
    local_4c = anon_unknown_70::structSizeFromSchema((StructSchema)local_58.raw);
    _::OrphanBuilder::asStructList(&local_48,&this->builder,local_4c);
    schema_00.elementType.field_4.schema = local_18.schema;
    schema_00.elementType.baseType = (undefined2)local_20;
    schema_00.elementType.listDepth = local_20._2_1_;
    schema_00.elementType.isImplicitParam = (bool)local_20._3_1_;
    schema_00.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_20._4_2_;
    schema_00.elementType._6_2_ = local_20._6_2_;
    builder.capTable = local_48.capTable;
    builder.segment = local_48.segment;
    builder.ptr = local_48.ptr;
    builder.elementCount = local_48.elementCount;
    builder.step = local_48.step;
    builder.structDataSize = local_48.structDataSize;
    builder.structPointerCount = local_48.structPointerCount;
    builder.elementSize = local_48.elementSize;
    builder._39_1_ = local_48._39_1_;
    DynamicList::Builder::Builder(__return_storage_ptr__,schema_00,builder);
  }
  else {
    local_68._0_2_ = (this->schema).elementType.baseType;
    local_68._2_1_ = (this->schema).elementType.listDepth;
    local_68._3_1_ = (this->schema).elementType.isImplicitParam;
    local_68._4_2_ = (this->schema).elementType.field_3;
    local_68._6_2_ = *(undefined2 *)&(this->schema).elementType.field_0x6;
    local_60 = (anon_union_8_2_eba6ea51_for_Type_5)(this->schema).elementType.field_4.schema;
    WVar1 = ListSchema::whichElementType(&this->schema);
    elementSize = anon_unknown_70::elementSizeFor(WVar1);
    _::OrphanBuilder::asList(&local_90,&this->builder,elementSize);
    schema.elementType.field_4.schema = local_60.schema;
    schema.elementType.baseType = (undefined2)local_68;
    schema.elementType.listDepth = local_68._2_1_;
    schema.elementType.isImplicitParam = (bool)local_68._3_1_;
    schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_68._4_2_;
    schema.elementType._6_2_ = local_68._6_2_;
    builder_00.capTable = local_90.capTable;
    builder_00.segment = local_90.segment;
    builder_00.ptr = local_90.ptr;
    builder_00.elementCount = local_90.elementCount;
    builder_00.step = local_90.step;
    builder_00.structDataSize = local_90.structDataSize;
    builder_00.structPointerCount = local_90.structPointerCount;
    builder_00.elementSize = local_90.elementSize;
    builder_00._39_1_ = local_90._39_1_;
    DynamicList::Builder::Builder(__return_storage_ptr__,schema,builder_00);
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicList::Builder Orphan<DynamicList>::get() {
  if (schema.whichElementType() == schema::Type::STRUCT) {
    return DynamicList::Builder(
        schema, builder.asStructList(structSizeFromSchema(schema.getStructElementType())));
  } else {
    return DynamicList::Builder(
        schema, builder.asList(elementSizeFor(schema.whichElementType())));
  }
}